

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

void __thiscall capnp::DynamicValue::Pipeline::Pipeline(Pipeline *this,Pipeline *other)

{
  Type TVar1;
  Pipeline *params;
  Client *params_00;
  Type local_20;
  bool local_19;
  Pipeline *pPStack_18;
  bool _kj_shouldLog;
  Pipeline *other_local;
  Pipeline *this_local;
  
  this->type = other->type;
  TVar1 = this->type;
  if (TVar1 != UNKNOWN) {
    pPStack_18 = other;
    other_local = this;
    if (TVar1 == STRUCT) {
      params = kj::mv<capnp::DynamicStruct::Pipeline>(&(other->field_1).structValue);
      kj::ctor<capnp::DynamicStruct::Pipeline,capnp::DynamicStruct::Pipeline>
                (&(this->field_1).structValue,params);
    }
    else if (TVar1 == CAPABILITY) {
      params_00 = kj::mv<capnp::DynamicCapability::Client>(&(other->field_1).capabilityValue);
      kj::ctor<capnp::DynamicCapability::Client,capnp::DynamicCapability::Client>
                (&(this->field_1).capabilityValue,params_00);
    }
    else {
      local_19 = kj::_::Debug::shouldLog(ERROR);
      while (local_19 != false) {
        local_20 = this->type;
        kj::_::Debug::log<char_const(&)[26],unsigned_int>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
                   ,0x682,ERROR,"\"Unexpected pipeline type.\", (uint)type",
                   (char (*) [26])"Unexpected pipeline type.",&local_20);
        local_19 = false;
      }
      this->type = UNKNOWN;
    }
  }
  return;
}

Assistant:

DynamicValue::Pipeline::Pipeline(Pipeline&& other) noexcept: type(other.type) {
  switch (type) {
    case UNKNOWN: break;
    case STRUCT: kj::ctor(structValue, kj::mv(other.structValue)); break;
    case CAPABILITY: kj::ctor(capabilityValue, kj::mv(other.capabilityValue)); break;
    default:
      KJ_LOG(ERROR, "Unexpected pipeline type.", (uint)type);
      type = UNKNOWN;
      break;
  }
}